

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void QCss::Scanner::scan(QString *preprocessedInput,QList<QCss::Symbol> *symbols)

{
  TokenType TVar1;
  long in_FS_OFFSET;
  undefined1 local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  int local_60;
  int iStack_5c;
  QCssScanner_Generated local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.lexemStart = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.lexemLength = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.input.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.input.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.input.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCssScanner_Generated::QCssScanner_Generated(&local_58,preprocessedInput);
  local_80 = (undefined1  [8])0xaaaaaaaa00000000;
  local_78._0_12_ = SUB1612((undefined1  [16])0x0,0);
  local_78.ptr._4_4_ = 0;
  local_78.size = 0;
  local_60 = 0;
  iStack_5c = -1;
  TVar1 = QCssScanner_Generated::lex(&local_58);
  while (TVar1 != ~NONE) {
    local_80._0_4_ = TVar1;
    QString::operator=((QString *)&local_78,(QString *)&local_58);
    local_60 = (int)local_58.lexemStart;
    iStack_5c = (int)local_58.lexemLength;
    QList<QCss::Symbol>::emplaceBack<QCss::Symbol_const&>(symbols,(Symbol *)local_80);
    TVar1 = QCssScanner_Generated::lex(&local_58);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Scanner::scan(const QString &preprocessedInput, QList<Symbol> *symbols)
{
    QCssScanner_Generated scanner(preprocessedInput);
    Symbol sym;
    int tok = scanner.lex();
    while (tok != -1) {
        sym.token = static_cast<QCss::TokenType>(tok);
        sym.text = scanner.input;
        sym.start = scanner.lexemStart;
        sym.len = scanner.lexemLength;
        symbols->append(sym);
        tok = scanner.lex();
    }
}